

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

bool __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::
InitializeSlots<std::allocator<char>,32ul,false,false,8ul>
          (HashSetResizeHelper *this,CommonFields *c,allocator<char> *param_3,undefined8 param_4,
          undefined8 param_5,undefined8 param_6)

{
  bool bVar1;
  GenerationType GVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  ctrl_t *pcVar6;
  bool grow_single_group;
  GenerationType old_generation;
  char *mem;
  RawHashSetLayout layout;
  bool has_infoz;
  HashtablezInfoHandle infoz;
  size_t value_size_local;
  size_t key_size_local;
  ctrl_t soo_slot_h2_local;
  CommonFields *c_local;
  HashSetResizeHelper *this_local;
  
  sVar3 = CommonFields::capacity(c);
  if (sVar3 == 0) {
    __assert_fail("c.capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7f5,
                  "bool absl::container_internal::HashSetResizeHelper::InitializeSlots(CommonFields &, Alloc, ctrl_t, size_t, size_t) [Alloc = std::allocator<char>, SizeOfSlot = 32UL, TransferUsesMemcpy = false, SooEnabled = false, AlignOfSlot = 8UL]"
                 );
  }
  bVar1 = ShouldSampleHashtablezInfo<std::allocator<char>>();
  if (bVar1) {
    SampleHashtablezInfo<false>(0x20,param_5,param_6,this->old_capacity_,this->was_soo_ & 1,c);
  }
  layout.slot_offset_._4_1_ =
       HashtablezInfoHandle::IsSampled((HashtablezInfoHandle *)((long)&layout.slot_offset_ + 7));
  sVar3 = CommonFields::capacity(c);
  RawHashSetLayout::RawHashSetLayout
            ((RawHashSetLayout *)&mem,sVar3,8,(bool)(layout.slot_offset_._4_1_ & 1));
  sVar3 = RawHashSetLayout::alloc_size((RawHashSetLayout *)&mem,0x20);
  pvVar4 = Allocate<8ul,std::allocator<char>>(param_3,sVar3);
  GVar2 = CommonFieldsGenerationInfoDisabled::generation((CommonFieldsGenerationInfoDisabled *)c);
  sVar3 = RawHashSetLayout::generation_offset((RawHashSetLayout *)&mem);
  CommonFieldsGenerationInfoDisabled::set_generation_ptr
            ((CommonFieldsGenerationInfoDisabled *)c,(GenerationType *)((long)pvVar4 + sVar3));
  GVar2 = NextGeneration(GVar2);
  CommonFieldsGenerationInfoDisabled::set_generation((CommonFieldsGenerationInfoDisabled *)c,GVar2);
  sVar3 = RawHashSetLayout::control_offset((RawHashSetLayout *)&mem);
  CommonFields::set_control(c,(ctrl_t *)((long)pvVar4 + sVar3));
  sVar3 = RawHashSetLayout::slot_offset((RawHashSetLayout *)&mem);
  CommonFields::set_slots(c,(void *)((long)pvVar4 + sVar3));
  ResetGrowthLeft(c);
  sVar3 = this->old_capacity_;
  sVar5 = RawHashSetLayout::capacity((RawHashSetLayout *)&mem);
  bVar1 = IsGrowingIntoSingleGroupApplicable(sVar3,sVar5);
  if ((this->old_capacity_ == 0) || (!bVar1)) {
    ResetCtrl(c,0x20);
  }
  else {
    pcVar6 = CommonFields::control(c);
    RawHashSetLayout::capacity((RawHashSetLayout *)&mem);
    absl::lts_20240722::container_internal::HashSetResizeHelper::
    GrowIntoSingleGroupShuffleControlBytes((ctrl_t *)this,(ulong)pcVar6);
  }
  CommonFields::set_has_infoz(c,(bool)(layout.slot_offset_._4_1_ & 1));
  if ((layout.slot_offset_._4_1_ & 1) != 0) {
    sVar3 = CommonFields::size(c);
    sVar5 = RawHashSetLayout::capacity((RawHashSetLayout *)&mem);
    HashtablezInfoHandle::RecordStorageChanged
              ((HashtablezInfoHandle *)((long)&layout.slot_offset_ + 7),sVar3,sVar5);
    if ((bVar1) || (this->old_capacity_ == 0)) {
      HashtablezInfoHandle::RecordRehash((HashtablezInfoHandle *)((long)&layout.slot_offset_ + 7),0)
      ;
    }
    CommonFields::set_infoz(c);
  }
  return bVar1;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE bool InitializeSlots(CommonFields& c, Alloc alloc,
                                               ctrl_t soo_slot_h2,
                                               size_t key_size,
                                               size_t value_size) {
    assert(c.capacity());
    HashtablezInfoHandle infoz =
        ShouldSampleHashtablezInfo<Alloc>()
            ? SampleHashtablezInfo<SooEnabled>(SizeOfSlot, key_size, value_size,
                                               old_capacity_, was_soo_,
                                               forced_infoz_, c)
            : HashtablezInfoHandle{};

    const bool has_infoz = infoz.IsSampled();
    RawHashSetLayout layout(c.capacity(), AlignOfSlot, has_infoz);
    char* mem = static_cast<char*>(Allocate<BackingArrayAlignment(AlignOfSlot)>(
        &alloc, layout.alloc_size(SizeOfSlot)));
    const GenerationType old_generation = c.generation();
    c.set_generation_ptr(
        reinterpret_cast<GenerationType*>(mem + layout.generation_offset()));
    c.set_generation(NextGeneration(old_generation));
    c.set_control(reinterpret_cast<ctrl_t*>(mem + layout.control_offset()));
    c.set_slots(mem + layout.slot_offset());
    ResetGrowthLeft(c);

    const bool grow_single_group =
        IsGrowingIntoSingleGroupApplicable(old_capacity_, layout.capacity());
    if (SooEnabled && was_soo_ && grow_single_group) {
      InitControlBytesAfterSoo(c.control(), soo_slot_h2, layout.capacity());
      if (TransferUsesMemcpy && had_soo_slot_) {
        TransferSlotAfterSoo(c, SizeOfSlot);
      }
      // SooEnabled implies that old_capacity_ != 0.
    } else if ((SooEnabled || old_capacity_ != 0) && grow_single_group) {
      if (TransferUsesMemcpy) {
        GrowSizeIntoSingleGroupTransferable(c, SizeOfSlot);
        DeallocateOld<AlignOfSlot>(alloc, SizeOfSlot);
      } else {
        GrowIntoSingleGroupShuffleControlBytes(c.control(), layout.capacity());
      }
    } else {
      ResetCtrl(c, SizeOfSlot);
    }

    c.set_has_infoz(has_infoz);
    if (has_infoz) {
      infoz.RecordStorageChanged(c.size(), layout.capacity());
      if ((SooEnabled && was_soo_) || grow_single_group || old_capacity_ == 0) {
        infoz.RecordRehash(0);
      }
      c.set_infoz(infoz);
    }
    return grow_single_group;
  }